

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<unsigned_long,1,3,1,1,3>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,Eigen::Matrix<unsigned_long,1,3,1,1,3>>,Eigen::internal::assign_op<unsigned_long,unsigned_long>>
               (Matrix<unsigned_long,_1,_3,_1,_1,_3> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>
               *src,assign_op<unsigned_long,_unsigned_long> *func)

{
  undefined8 func_00;
  Matrix<unsigned_long,_1,_3,_1,_1,_3> *dstExpr;
  undefined1 local_70 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_30 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<unsigned_long,_unsigned_long> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>
  *src_local;
  Matrix<unsigned_long,_1,_3,_1,_1,_3> *dst_local;
  
  srcEvaluator._8_8_ = func;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>
  ::evaluator((evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>
               *)local_30,src);
  resize_if_allowed<Eigen::Matrix<unsigned_long,1,3,1,1,3>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,Eigen::Matrix<unsigned_long,1,3,1,1,3>>,unsigned_long,unsigned_long>
            (dst,src,(assign_op<unsigned_long,_unsigned_long> *)srcEvaluator._8_8_);
  evaluator<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>::evaluator
            ((evaluator<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator._8_8_;
  dstExpr = EigenBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::assign_op<unsigned_long,_unsigned_long>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::assign_op<unsigned_long,_unsigned_long>,_0>
              *)local_70,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_30,
             (assign_op<unsigned_long,_unsigned_long> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::assign_op<unsigned_long,_unsigned_long>,_0>,_1,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::assign_op<unsigned_long,_unsigned_long>,_0>
         *)local_70);
  evaluator<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>::~evaluator
            ((evaluator<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>
  ::~evaluator((evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>
                *)local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}